

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O1

BlendFunc StringToBlendFunc(string *m)

{
  int iVar1;
  BlendFunc BVar2;
  Logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)m);
  if (iVar1 == 0) {
    BVar2 = BLEND_GL_ONE;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)m);
    if (iVar1 == 0) {
      BVar2 = BLEND_GL_ZERO;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)m);
      if (iVar1 == 0) {
        BVar2 = BLEND_GL_SRC_ALPHA;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)m);
        if (iVar1 == 0) {
          BVar2 = BLEND_GL_ONE_MINUS_SRC_ALPHA;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)m);
          if (iVar1 == 0) {
            BVar2 = BLEND_GL_ONE_MINUS_DST_COLOR;
          }
          else {
            this = Assimp::DefaultLogger::get();
            std::operator+(&local_38,"Q3Shader: Unknown blend function: ",m);
            Assimp::Logger::error(this,local_38._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_38._M_dataplus._M_p != &local_38.field_2) {
              operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
            }
            BVar2 = BLEND_NONE;
          }
        }
      }
    }
  }
  return BVar2;
}

Assistant:

Q3Shader::BlendFunc StringToBlendFunc(const std::string& m)
{
    if (m == "GL_ONE") {
        return Q3Shader::BLEND_GL_ONE;
    }
    if (m == "GL_ZERO") {
        return Q3Shader::BLEND_GL_ZERO;
    }
    if (m == "GL_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_DST_COLOR") {
        return Q3Shader::BLEND_GL_ONE_MINUS_DST_COLOR;
    }
    ASSIMP_LOG_ERROR("Q3Shader: Unknown blend function: " + m);
    return Q3Shader::BLEND_NONE;
}